

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1b9cf::BuildSystemFrontendExecutionQueueDelegate::processFinished
          (BuildSystemFrontendExecutionQueueDelegate *this,ProcessContext *command,
          ProcessHandle handle,ProcessResult *result)

{
  BuildSystem *this_00;
  BuildSystemDelegate *pBVar1;
  
  this_00 = (this->delegateImpl->frontend->system)._M_t.
            super___uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
            ._M_t.
            super__Tuple_impl<0UL,_llbuild::buildsystem::BuildSystem_*,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
            .super__Head_base<0UL,_llbuild::buildsystem::BuildSystem_*,_false>._M_head_impl;
  if (this_00 != (BuildSystem *)0x0) {
    pBVar1 = llbuild::buildsystem::BuildSystem::getDelegate(this_00);
    (*pBVar1->_vptr_BuildSystemDelegate[0x1a])
              (pBVar1,command,handle.id,result,pBVar1->_vptr_BuildSystemDelegate[0x1a]);
    return;
  }
  __assert_fail("delegateImpl.frontend->system",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystemFrontend.cpp"
                ,0x1f0,
                "BuildSystem &(anonymous namespace)::BuildSystemFrontendExecutionQueueDelegate::getSystem() const"
               );
}

Assistant:

BuildSystem& BuildSystemFrontendExecutionQueueDelegate::getSystem() const {
  assert(delegateImpl.frontend->system);
  return *delegateImpl.frontend->system;
}